

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void dxil_spv::CFGStructurizer::isolate_structured
               (UnorderedSet<CFGNode_*> *nodes,CFGNode *header,CFGNode *merge)

{
  bool bVar1;
  reference ppCVar2;
  size_type sVar3;
  CFGNode *local_40;
  CFGNode *pred;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *merge_local;
  CFGNode *header_local;
  UnorderedSet<CFGNode_*> *nodes_local;
  
  __end1 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
           begin(&merge->pred);
  pred = (CFGNode *)
         std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::end
                   (&merge->pred);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                *)&pred);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
              ::operator*(&__end1);
    local_40 = *ppCVar2;
    if (local_40 != header) {
      sVar3 = std::
              unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ::count(nodes,&local_40);
      if (sVar3 == 0) {
        std::
        unordered_set<dxil_spv::CFGNode_*,_std::hash<dxil_spv::CFGNode_*>,_std::equal_to<dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ::insert(nodes,&local_40);
        isolate_structured(nodes,header,local_40);
      }
    }
    __gnu_cxx::
    __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CFGStructurizer::isolate_structured(UnorderedSet<CFGNode *> &nodes, const CFGNode *header,
                                         const CFGNode *merge)
{
	for (auto *pred : merge->pred)
	{
		if (pred != header && nodes.count(pred) == 0)
		{
			nodes.insert(pred);
			isolate_structured(nodes, header, pred);
		}
	}
}